

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall cmTargetTraceDependencies::IsUtility(cmTargetTraceDependencies *this,string *dep)

{
  bool bVar1;
  __type _Var2;
  TargetType TVar3;
  cmLocalGenerator *this_00;
  char *pcVar4;
  string local_140;
  string local_120;
  undefined1 local_100 [8];
  string depLocation;
  allocator local_b9;
  undefined1 local_b8 [8];
  string tLocation;
  cmGeneratorTarget *t;
  string local_60;
  undefined1 local_40 [8];
  string util;
  string *dep_local;
  cmTargetTraceDependencies *this_local;
  
  util.field_2._8_8_ = dep;
  cmsys::SystemTools::GetFilenameName((string *)local_40,dep);
  cmsys::SystemTools::GetFilenameLastExtension(&local_60,(string *)local_40);
  bVar1 = std::operator==(&local_60,".exe");
  std::__cxx11::string::~string((string *)&local_60);
  if (bVar1) {
    cmsys::SystemTools::GetFilenameWithoutLastExtension((string *)&t,(string *)local_40);
    std::__cxx11::string::operator=((string *)local_40,(string *)&t);
    std::__cxx11::string::~string((string *)&t);
  }
  this_00 = cmGeneratorTarget::GetLocalGenerator(this->GeneratorTarget);
  tLocation.field_2._8_8_ = cmLocalGenerator::FindGeneratorTargetToUse(this_00,(string *)local_40);
  if ((cmGeneratorTarget *)tLocation.field_2._8_8_ != (cmGeneratorTarget *)0x0) {
    pcVar4 = (char *)std::__cxx11::string::c_str();
    bVar1 = cmsys::SystemTools::FileIsFullPath(pcVar4);
    if (!bVar1) {
      cmTarget::AddUtility(this->GeneratorTarget->Target,(string *)local_40,(cmMakefile *)0x0);
      this_local._7_1_ = 1;
      goto LAB_00831b9c;
    }
    TVar3 = cmGeneratorTarget::GetType((cmGeneratorTarget *)tLocation.field_2._8_8_);
    if ((-1 < (int)TVar3) &&
       (TVar3 = cmGeneratorTarget::GetType((cmGeneratorTarget *)tLocation.field_2._8_8_),
       (int)TVar3 < 4)) {
      pcVar4 = cmGeneratorTarget::GetLocationForBuild((cmGeneratorTarget *)tLocation.field_2._8_8_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_b8,pcVar4,&local_b9);
      std::allocator<char>::~allocator((allocator<char> *)&local_b9);
      cmsys::SystemTools::GetFilenamePath
                ((string *)((long)&depLocation.field_2 + 8),(string *)local_b8);
      std::__cxx11::string::operator=
                ((string *)local_b8,(string *)(depLocation.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(depLocation.field_2._M_local_buf + 8));
      cmsys::SystemTools::GetFilenamePath((string *)local_100,(string *)util.field_2._8_8_);
      cmsys::SystemTools::CollapseFullPath(&local_120,(string *)local_100);
      std::__cxx11::string::operator=((string *)local_100,(string *)&local_120);
      std::__cxx11::string::~string((string *)&local_120);
      cmsys::SystemTools::CollapseFullPath(&local_140,(string *)local_b8);
      std::__cxx11::string::operator=((string *)local_b8,(string *)&local_140);
      std::__cxx11::string::~string((string *)&local_140);
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_100,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_b8);
      if (_Var2) {
        cmTarget::AddUtility(this->GeneratorTarget->Target,(string *)local_40,(cmMakefile *)0x0);
        this_local._7_1_ = 1;
      }
      std::__cxx11::string::~string((string *)local_100);
      std::__cxx11::string::~string((string *)local_b8);
      if (_Var2) goto LAB_00831b9c;
    }
  }
  this_local._7_1_ = 0;
LAB_00831b9c:
  std::__cxx11::string::~string((string *)local_40);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmTargetTraceDependencies::IsUtility(std::string const& dep)
{
  // Dependencies on targets (utilities) are supposed to be named by
  // just the target name.  However for compatibility we support
  // naming the output file generated by the target (assuming there is
  // no output-name property which old code would not have set).  In
  // that case the target name will be the file basename of the
  // dependency.
  std::string util = cmSystemTools::GetFilenameName(dep);
  if(cmSystemTools::GetFilenameLastExtension(util) == ".exe")
    {
    util = cmSystemTools::GetFilenameWithoutLastExtension(util);
    }

  // Check for a target with this name.
  if(cmGeneratorTarget* t
                    = this->GeneratorTarget->
                    GetLocalGenerator()->FindGeneratorTargetToUse(util))
    {
    // If we find the target and the dep was given as a full path,
    // then make sure it was not a full path to something else, and
    // the fact that the name matched a target was just a coincidence.
    if(cmSystemTools::FileIsFullPath(dep.c_str()))
      {
      if(t->GetType() >= cmState::EXECUTABLE &&
         t->GetType() <= cmState::MODULE_LIBRARY)
        {
        // This is really only for compatibility so we do not need to
        // worry about configuration names and output names.
        std::string tLocation = t->GetLocationForBuild();
        tLocation = cmSystemTools::GetFilenamePath(tLocation);
        std::string depLocation = cmSystemTools::GetFilenamePath(dep);
        depLocation = cmSystemTools::CollapseFullPath(depLocation);
        tLocation = cmSystemTools::CollapseFullPath(tLocation);
        if(depLocation == tLocation)
          {
          this->GeneratorTarget->Target->AddUtility(util);
          return true;
          }
        }
      }
    else
      {
      // The original name of the dependency was not a full path.  It
      // must name a target, so add the target-level dependency.
      this->GeneratorTarget->Target->AddUtility(util);
      return true;
      }
    }

  // The dependency does not name a target built in this project.
  return false;
}